

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

TypeRef __thiscall clickhouse::Type::CreateNullable(Type *this,TypeRef *nested_type)

{
  undefined8 *puVar1;
  Type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TypeRef TVar2;
  
  this_00 = (Type *)operator_new(0x10);
  Type(this_00,Nullable);
  *(Type **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<clickhouse::Type*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_1,this_00);
  puVar1 = *(undefined8 **)(*(long *)this + 8);
  *puVar1 = (nested_type->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),
             &(nested_type->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TypeRef)TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateNullable(TypeRef nested_type) {
    TypeRef type(new Type(Type::Nullable));
    type->nullable_->nested_type = nested_type;
    return type;
}